

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O3

int decode_gost_algor_params(EVP_PKEY *pkey,X509_ALGOR *palg)

{
  int iVar1;
  int iVar2;
  int iVar3;
  GOST_KEY_PARAMS *a;
  ASN1_STRING *pval;
  int ptype;
  ASN1_OBJECT *palg_obj;
  uchar *p;
  int *local_40;
  int local_34;
  ASN1_OBJECT *local_30;
  uchar *local_28;
  
  local_30 = (ASN1_OBJECT *)0x0;
  local_34 = -1;
  local_40 = (int *)0x0;
  if (palg != (X509_ALGOR *)0x0 && pkey != (EVP_PKEY *)0x0) {
    X509_ALGOR_get0(&local_30,&local_34,&local_40,(X509_ALGOR *)palg);
    if (local_34 == 0x10) {
      local_28 = *(uchar **)(local_40 + 2);
      iVar1 = OBJ_obj2nid(local_30);
      a = d2i_GOST_KEY_PARAMS((GOST_KEY_PARAMS **)0x0,&local_28,(long)*local_40);
      if (a != (GOST_KEY_PARAMS *)0x0) {
        iVar2 = OBJ_obj2nid((ASN1_OBJECT *)a->key_params);
        GOST_KEY_PARAMS_free(a);
        iVar3 = EVP_PKEY_set_type((EVP_PKEY *)pkey,iVar1);
        if (iVar3 != 0) {
          iVar1 = gost_decode_nid_params(pkey,iVar1,iVar2);
          return iVar1;
        }
        ERR_GOST_error(100,0xc0103,
                       "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ameth.c"
                       ,0xb4);
        return 0;
      }
      iVar2 = 0x65;
      iVar1 = 0xae;
    }
    else {
      iVar2 = 100;
      iVar1 = 0xa5;
    }
    ERR_GOST_error(100,iVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ameth.c"
                   ,iVar1);
  }
  return 0;
}

Assistant:

static int decode_gost_algor_params(EVP_PKEY *pkey,
                                    const X509_ALGOR *palg)
{
    const ASN1_OBJECT *palg_obj = NULL;
    int ptype = V_ASN1_UNDEF;
    int pkey_nid = NID_undef, param_nid = NID_undef;
    ASN1_STRING *pval = NULL;
    const unsigned char *p;
    GOST_KEY_PARAMS *gkp = NULL;

    if (!pkey || !palg)
        return 0;
    X509_ALGOR_get0(&palg_obj, &ptype, (const void **)&pval, palg);
    if (ptype != V_ASN1_SEQUENCE) {
        GOSTerr(GOST_F_DECODE_GOST_ALGOR_PARAMS,
                GOST_R_BAD_KEY_PARAMETERS_FORMAT);
        return 0;
    }
    p = pval->data;
    pkey_nid = OBJ_obj2nid(palg_obj);

    gkp = d2i_GOST_KEY_PARAMS(NULL, &p, pval->length);
    if (!gkp) {
        GOSTerr(GOST_F_DECODE_GOST_ALGOR_PARAMS,
                GOST_R_BAD_PKEY_PARAMETERS_FORMAT);
        return 0;
    }
    param_nid = OBJ_obj2nid(gkp->key_params);
    GOST_KEY_PARAMS_free(gkp);
    if (!EVP_PKEY_set_type(pkey, pkey_nid)) {
        GOSTerr(GOST_F_DECODE_GOST_ALGOR_PARAMS, ERR_R_INTERNAL_ERROR);
        return 0;
    }
    return gost_decode_nid_params(pkey, pkey_nid, param_nid);
}